

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_32s_P3C3(OPJ_INT32 **pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length,OPJ_INT32 adjust)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_SIZE_T OVar5;
  
  if (length != 0) {
    pOVar1 = *pSrc;
    pOVar2 = pSrc[1];
    pOVar3 = pSrc[2];
    pOVar4 = pDst + 2;
    OVar5 = 0;
    do {
      pOVar4[-2] = pOVar1[OVar5] + adjust;
      pOVar4[-1] = pOVar2[OVar5] + adjust;
      *pOVar4 = pOVar3[OVar5] + adjust;
      OVar5 = OVar5 + 1;
      pOVar4 = pOVar4 + 3;
    } while (length != OVar5);
  }
  return;
}

Assistant:

static void convert_32s_P3C3(OPJ_INT32 const* const* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length, OPJ_INT32 adjust)
{
	OPJ_SIZE_T i;
	const OPJ_INT32* pSrc0 = pSrc[0];
	const OPJ_INT32* pSrc1 = pSrc[1];
	const OPJ_INT32* pSrc2 = pSrc[2];
	
	for (i = 0; i < length; i++) {
		pDst[3*i+0] = pSrc0[i] + adjust;
		pDst[3*i+1] = pSrc1[i] + adjust;
		pDst[3*i+2] = pSrc2[i] + adjust;
	}
}